

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationXX.hpp
# Opt level: O2

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::RotationXX<std::complex<float>_>::matrix(RotationXX<std::complex<float>_> *this)

{
  complex<float> m10;
  complex<float> m30;
  data_type extraout_RDX;
  long in_RSI;
  complex<float> m00;
  SquareMatrix<std::complex<float>_> SVar1;
  
  m00._M_value = (ulong)(*(uint *)(in_RSI + 0x18) ^ (uint)DAT_003b8150) << 0x20;
  m10._M_value._4_4_ = 0;
  m10._M_value._0_4_ = *(uint *)(in_RSI + 0x14);
  m30._M_value._4_4_ = 0;
  m30._M_value._0_4_ = *(uint *)(in_RSI + 0x14);
  dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)this,m00,(complex<float>)0x0,(complex<float>)0x0,
             (complex<float>)0x0,m10,(complex<float>)0x0,m00,m10,(complex<float>)0x0,m00,
             (complex<float>)0x0,(complex<float>)0x0,m30,m30,(complex<float>)0x0,(complex<float>)0x0
            );
  SVar1.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar1.size_ = (size_type_conflict)this;
  return SVar1;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          const T d = this->cos() ;
          const T o = T(0,-this->sin()) ;
          return qclab::dense::SquareMatrix< T >( d , 0 , 0 , o ,
                                                  0 , d , o , 0 ,
                                                  0 , o , d , 0 ,
                                                  o , 0 , 0 , d ) ;
        }